

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::~D3MFExporter(D3MFExporter *this)

{
  OpcPackageRelationship *this_00;
  size_type sVar1;
  reference ppOVar2;
  ulong local_18;
  size_t i;
  D3MFExporter *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
            ::size(&this->mRelations);
    if (sVar1 <= local_18) break;
    ppOVar2 = std::
              vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
              ::operator[](&this->mRelations,local_18);
    this_00 = *ppOVar2;
    if (this_00 != (OpcPackageRelationship *)0x0) {
      OpcPackageRelationship::~OpcPackageRelationship(this_00);
      operator_delete(this_00,0x60);
    }
    local_18 = local_18 + 1;
  }
  std::
  vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ::clear(&this->mRelations);
  std::
  vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ::~vector(&this->mRelations);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->mBuildItems);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mContentOutput);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mRelOutput);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mModelOutput);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

D3MFExporter::~D3MFExporter() {
    for ( size_t i = 0; i < mRelations.size(); ++i ) {
        delete mRelations[ i ];
    }
    mRelations.clear();
}